

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,string *name,PlaceholderType placeholder_type)

{
  bool bVar1;
  char *pcVar2;
  Tables *pTVar3;
  FileDescriptor *pFVar4;
  EnumDescriptor *pEVar5;
  EnumOptions *pEVar6;
  EnumValueDescriptor *pEVar7;
  string *psVar8;
  ulong uVar9;
  EnumValueOptions *pEVar10;
  Descriptor *pDVar11;
  MessageOptions *pMVar12;
  ExtensionRange *pEVar13;
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *this_00;
  Symbol SVar14;
  string *local_1f0;
  Descriptor *placeholder_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator local_119;
  string local_118;
  undefined8 *local_f8;
  EnumValueDescriptor *placeholder_value;
  EnumDescriptor *placeholder_enum;
  FileDescriptor *local_c8;
  FileDescriptor *placeholder_file;
  string local_a0;
  long local_80;
  size_type dotpos;
  string local_68;
  string *local_48;
  string *placeholder_package;
  string *placeholder_name;
  string *placeholder_full_name;
  string *psStack_28;
  PlaceholderType placeholder_type_local;
  string *name_local;
  DescriptorPool *this_local;
  anon_union_8_8_13f84498_for_Symbol_2 local_10;
  
  placeholder_full_name._4_4_ = placeholder_type;
  psStack_28 = name;
  name_local = (string *)this;
  if (this->mutex_ != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this->mutex_);
  }
  bVar1 = ValidateQualifiedName(psStack_28);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psStack_28);
    if (*pcVar2 == '.') {
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)psStack_28);
      placeholder_name = Tables::AllocateString(pTVar3,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      placeholder_name = Tables::AllocateString(pTVar3,psStack_28);
    }
    local_80 = std::__cxx11::string::find_last_of((char)placeholder_name,0x2e);
    if (local_80 == -1) {
      local_48 = internal::GetEmptyString_abi_cxx11_();
      placeholder_package = placeholder_name;
    }
    else {
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)placeholder_name);
      local_48 = Tables::AllocateString(pTVar3,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      std::__cxx11::string::substr((ulong)&placeholder_file,(ulong)placeholder_name);
      placeholder_package = Tables::AllocateString(pTVar3,(string *)&placeholder_file);
      std::__cxx11::string::~string((string *)&placeholder_file);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &placeholder_enum,placeholder_name,".placeholder.proto");
    pFVar4 = NewPlaceholderFileWithMutexHeld
                       (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &placeholder_enum);
    std::__cxx11::string::~string((string *)&placeholder_enum);
    *(string **)(pFVar4 + 8) = local_48;
    local_c8 = pFVar4;
    if (placeholder_full_name._4_4_ == PLACEHOLDER_ENUM) {
      *(undefined4 *)(pFVar4 + 0x68) = 1;
      this_00 = &this->tables_;
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
      pEVar5 = Tables::AllocateArray<google::protobuf::EnumDescriptor>(pTVar3,1);
      *(EnumDescriptor **)(local_c8 + 0x70) = pEVar5;
      placeholder_value = *(EnumValueDescriptor **)(local_c8 + 0x70);
      *(undefined8 *)(placeholder_value + 0x20) = 0;
      *(undefined8 *)(placeholder_value + 0x28) = 0;
      *(undefined8 *)(placeholder_value + 0x10) = 0;
      *(undefined8 *)(placeholder_value + 0x18) = 0;
      *(undefined8 *)placeholder_value = 0;
      *(undefined8 *)(placeholder_value + 8) = 0;
      *(undefined8 *)(placeholder_value + 0x30) = 0;
      *(string **)(placeholder_value + 8) = placeholder_name;
      *(string **)placeholder_value = placeholder_package;
      *(FileDescriptor **)(placeholder_value + 0x10) = local_c8;
      pEVar6 = EnumOptions::default_instance();
      *(EnumOptions **)(placeholder_value + 0x20) = pEVar6;
      placeholder_value[0x28] = (EnumValueDescriptor)0x1;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psStack_28);
      placeholder_value[0x29] = (EnumValueDescriptor)(*pcVar2 != '.');
      *(undefined4 *)(placeholder_value + 0x2c) = 1;
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
      pEVar7 = Tables::AllocateArray<google::protobuf::EnumValueDescriptor>(pTVar3,1);
      *(EnumValueDescriptor **)(placeholder_value + 0x30) = pEVar7;
      local_f8 = *(undefined8 **)(placeholder_value + 0x30);
      local_f8[2] = 0;
      local_f8[3] = 0;
      *local_f8 = 0;
      local_f8[1] = 0;
      local_f8[4] = 0;
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,"PLACEHOLDER_VALUE",&local_119);
      psVar8 = Tables::AllocateString(pTVar3,&local_118);
      *local_f8 = psVar8;
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      uVar9 = std::__cxx11::string::empty();
      bVar1 = (uVar9 & 1) != 0;
      if (bVar1) {
        local_1f0 = (string *)*local_f8;
      }
      else {
        pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&this->tables_);
        std::operator+(&local_140,local_48,".PLACEHOLDER_VALUE");
        local_1f0 = Tables::AllocateString(pTVar3,&local_140);
      }
      placeholder_message._7_1_ = !bVar1;
      local_f8[1] = local_1f0;
      if (placeholder_message._7_1_) {
        std::__cxx11::string::~string((string *)&local_140);
      }
      *(undefined4 *)(local_f8 + 2) = 0;
      local_f8[3] = placeholder_value;
      pEVar10 = EnumValueOptions::default_instance();
      local_f8[4] = pEVar10;
      Symbol::Symbol((Symbol *)&this_local,(EnumDescriptor *)placeholder_value);
    }
    else {
      *(undefined4 *)(pFVar4 + 0x58) = 1;
      pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      pDVar11 = Tables::AllocateArray<google::protobuf::Descriptor>(pTVar3,1);
      *(Descriptor **)(local_c8 + 0x60) = pDVar11;
      pDVar11 = *(Descriptor **)(local_c8 + 0x60);
      memset(pDVar11,0,0xa8);
      *(string **)(pDVar11 + 8) = placeholder_name;
      *(string **)pDVar11 = placeholder_package;
      *(FileDescriptor **)(pDVar11 + 0x10) = local_c8;
      pMVar12 = MessageOptions::default_instance();
      *(MessageOptions **)(pDVar11 + 0x20) = pMVar12;
      pDVar11[0x28] = (Descriptor)0x1;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psStack_28);
      pDVar11[0x29] = (Descriptor)(*pcVar2 != '.');
      if (placeholder_full_name._4_4_ == PLACEHOLDER_EXTENDABLE_MESSAGE) {
        *(undefined4 *)(pDVar11 + 0x68) = 1;
        pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&this->tables_);
        pEVar13 = Tables::AllocateArray<google::protobuf::Descriptor::ExtensionRange>(pTVar3,1);
        *(ExtensionRange **)(pDVar11 + 0x70) = pEVar13;
        **(undefined4 **)(pDVar11 + 0x70) = 1;
        *(undefined4 *)(*(long *)(pDVar11 + 0x70) + 4) = 0x20000000;
      }
      Symbol::Symbol((Symbol *)&this_local,pDVar11);
    }
  }
  else {
    this_local = (anonymous_namespace)::kNullSymbol;
    local_10 = DAT_00da5728;
  }
  SVar14._0_8_ = (ulong)this_local & 0xffffffff;
  SVar14.field_1.descriptor = local_10.descriptor;
  return SVar14;
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    const string& name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  const string* placeholder_full_name;
  const string* placeholder_name;
  const string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = tables_->AllocateString(name.substr(1));
  } else {
    placeholder_full_name = tables_->AllocateString(name);
  }

  string::size_type dotpos = placeholder_full_name->find_last_of('.');
  if (dotpos != string::npos) {
    placeholder_package = tables_->AllocateString(
      placeholder_full_name->substr(0, dotpos));
    placeholder_name = tables_->AllocateString(
      placeholder_full_name->substr(dotpos + 1));
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      *placeholder_full_name + ".placeholder.proto");
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ =
      tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(placeholder_enum, 0, sizeof(*placeholder_enum));

    placeholder_enum->full_name_ = placeholder_full_name;
    placeholder_enum->name_ = placeholder_name;
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(placeholder_value, 0, sizeof(*placeholder_value));

    placeholder_value->name_ = tables_->AllocateString("PLACEHOLDER_VALUE");
    // Note that enum value names are siblings of their type, not children.
    placeholder_value->full_name_ =
      placeholder_package->empty() ? placeholder_value->name_ :
        tables_->AllocateString(*placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ =
      tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(placeholder_message, 0, sizeof(*placeholder_message));

    placeholder_message->full_name_ = placeholder_full_name;
    placeholder_message->name_ = placeholder_name;
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
        tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
        FieldDescriptor::kMaxNumber + 1;
    }

    return Symbol(placeholder_message);
  }
}